

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SourceLineInfo * __thiscall
Catch::AssertionResult::getSourceInfo(SourceLineInfo *__return_storage_ptr__,AssertionResult *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->file)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->file).field_2
  ;
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_info).lineInfo.file._M_string_length);
  __return_storage_ptr__->line = (this->m_info).lineInfo.line;
  return __return_storage_ptr__;
}

Assistant:

SourceLineInfo AssertionResult::getSourceInfo() const {
        return m_info.lineInfo;
    }